

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_length(lys_module *module,yang_type *stype,char *value,int is_ext_instance)

{
  LY_ERR *pLVar1;
  ly_ctx *plVar2;
  lys_module *local_38;
  lys_restr *length;
  int is_ext_instance_local;
  char *value_local;
  yang_type *stype_local;
  lys_module *module_local;
  
  local_38 = (lys_module *)stype;
  if (is_ext_instance == 0) {
    if ((stype->base == LY_TYPE_DER) || (stype->base == LY_TYPE_STRING)) {
      stype->base = LY_TYPE_STRING;
      if ((stype->type->info).bits.bit == (lys_type_bit *)0x0) {
        local_38 = (lys_module *)calloc(1,0x38);
        if (local_38 != (lys_module *)0x0) {
          (stype->type->info).bits.bit = (lys_type_bit *)local_38;
          goto LAB_0016ead8;
        }
        pLVar1 = ly_errno_location();
        *pLVar1 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_length");
      }
      else {
        ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"length","type");
      }
    }
    else {
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unexpected length statement.");
    }
    free(value);
    module_local = (lys_module *)0x0;
  }
  else {
LAB_0016ead8:
    plVar2 = (ly_ctx *)lydict_insert_zc(module->ctx,value);
    local_38->ctx = plVar2;
    module_local = local_38;
  }
  return module_local;
}

Assistant:

void *
yang_read_length(struct lys_module *module, struct yang_type *stype, char *value, int is_ext_instance)
{
    struct lys_restr *length;

    if (is_ext_instance) {
        length = (struct lys_restr *)stype;
    } else {
        if (stype->base == 0 || stype->base == LY_TYPE_STRING) {
            stype->base = LY_TYPE_STRING;
        } else {
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unexpected length statement.");
            goto error;
        }

        if (stype->type->info.str.length) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "length", "type");
            goto error;
        }
        length = calloc(1, sizeof *length);
        if (!length) {
            LOGMEM;
            goto error;
        }
        stype->type->info.str.length = length;
    }
    length->expr = lydict_insert_zc(module->ctx, value);
    return length;

error:
    free(value);
    return NULL;
}